

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::Version::GetOverlappingInputs
          (Version *this,int level,InternalKey *begin,InternalKey *end,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs)

{
  int iVar1;
  Comparator *pCVar2;
  FileMetaData *pFVar3;
  reference ppFVar4;
  Slice SVar5;
  undefined1 local_a8 [8];
  Slice file_limit;
  Slice file_start;
  FileMetaData *f;
  size_t i;
  Comparator *user_cmp;
  char *local_68;
  char *local_60;
  undefined1 local_50 [8];
  Slice user_end;
  Slice user_begin;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs_local;
  InternalKey *end_local;
  InternalKey *begin_local;
  int level_local;
  Version *this_local;
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                  ,0x20a,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  if (level < 7) {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::clear(inputs);
    Slice::Slice((Slice *)&user_end.size_);
    Slice::Slice((Slice *)local_50);
    if (begin != (InternalKey *)0x0) {
      SVar5 = InternalKey::user_key(begin);
      local_60 = SVar5.data_;
      user_end.size_ = (size_t)local_60;
    }
    if (end != (InternalKey *)0x0) {
      SVar5 = InternalKey::user_key(end);
      user_cmp = (Comparator *)SVar5.data_;
      local_50 = (undefined1  [8])user_cmp;
      local_68 = (char *)SVar5.size_;
      user_end.data_ = local_68;
    }
    pCVar2 = InternalKeyComparator::user_comparator(&this->vset_->icmp_);
    f = (FileMetaData *)0x0;
    while (pFVar3 = (FileMetaData *)
                    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                    size(this->files_ + level), f < pFVar3) {
      pFVar3 = (FileMetaData *)((long)&f->refs + 1);
      ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](this->files_ + level,(size_type)f);
      file_start.size_ = (size_t)*ppFVar4;
      join_0x00000010_0x00000000_ = InternalKey::user_key(&((value_type)file_start.size_)->smallest)
      ;
      _local_a8 = InternalKey::user_key((InternalKey *)(file_start.size_ + 0x38));
      f = pFVar3;
      if ((((begin == (InternalKey *)0x0) ||
           (iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,local_a8,&user_end.size_), -1 < iVar1)) &&
          ((end == (InternalKey *)0x0 ||
           (iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&file_limit.size_,local_50), iVar1 < 1))))
         && (std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
             push_back(inputs,(value_type *)&file_start.size_), level == 0)) {
        if ((begin == (InternalKey *)0x0) ||
           (iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&file_limit.size_,&user_end.size_),
           -1 < iVar1)) {
          if ((end != (InternalKey *)0x0) &&
             (iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,local_a8,local_50), 0 < iVar1)) {
            local_50 = local_a8;
            user_end.data_ = file_limit.data_;
            std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::clear
                      (inputs);
            f = (FileMetaData *)0x0;
          }
        }
        else {
          user_end.size_ = file_limit.size_;
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::clear
                    (inputs);
          f = (FileMetaData *)0x0;
        }
      }
    }
    return;
  }
  __assert_fail("level < config::kNumLevels",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                ,0x20b,
                "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
               );
}

Assistant:

void Version::GetOverlappingInputs(int level, const InternalKey* begin,
                                   const InternalKey* end,
                                   std::vector<FileMetaData*>* inputs) {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  inputs->clear();
  Slice user_begin, user_end;
  if (begin != nullptr) {
    user_begin = begin->user_key();
  }
  if (end != nullptr) {
    user_end = end->user_key();
  }
  const Comparator* user_cmp = vset_->icmp_.user_comparator();
  for (size_t i = 0; i < files_[level].size();) {
    FileMetaData* f = files_[level][i++];
    const Slice file_start = f->smallest.user_key();
    const Slice file_limit = f->largest.user_key();
    if (begin != nullptr && user_cmp->Compare(file_limit, user_begin) < 0) {
      // "f" is completely before specified range; skip it
    } else if (end != nullptr && user_cmp->Compare(file_start, user_end) > 0) {
      // "f" is completely after specified range; skip it
    } else {
      inputs->push_back(f);
      if (level == 0) {
        // Level-0 files may overlap each other.  So check if the newly
        // added file has expanded the range.  If so, restart search.
        if (begin != nullptr && user_cmp->Compare(file_start, user_begin) < 0) {
          user_begin = file_start;
          inputs->clear();
          i = 0;
        } else if (end != nullptr &&
                   user_cmp->Compare(file_limit, user_end) > 0) {
          user_end = file_limit;
          inputs->clear();
          i = 0;
        }
      }
    }
  }
}